

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O2

void dequantize_row_q4_K(block_q4_K *x,float *y,int64_t k)

{
  block_q4_K *pbVar1;
  uint8_t *q;
  int l_1;
  int l;
  long lVar2;
  uint8_t *puVar3;
  uint j;
  uint8_t m;
  uint8_t sc;
  byte local_7a;
  byte local_79;
  float local_78;
  float local_74;
  float local_70;
  uint local_6c;
  block_q4_K *local_68;
  ulong local_60;
  ulong local_58;
  uint8_t *local_50;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_58 = 0;
  local_68 = x;
  local_60 = k / 0x100 & 0xffffffff;
  if ((int)(k / 0x100) < 1) {
    local_60 = local_58;
  }
  for (; local_58 != local_60; local_58 = local_58 + 1) {
    pbVar1 = local_68 + local_58;
    puVar3 = pbVar1->qs;
    local_78 = ggml_table_f32_f16[(pbVar1->field_0).field_0.d];
    local_48 = -ggml_table_f32_f16[(pbVar1->field_0).field_0.dmin];
    local_50 = local_68[local_58].scales;
    j = 0;
    uStack_44 = 0x80000000;
    uStack_40 = 0x80000000;
    uStack_3c = 0x80000000;
    for (local_6c = 0; q = local_50, local_6c < 0x100; local_6c = local_6c + 0x40) {
      get_scale_min_k4(j,local_50,&local_79,&local_7a);
      local_70 = (float)local_7a;
      local_74 = (float)local_79 * local_78;
      get_scale_min_k4(j | 1,q,&local_79,&local_7a);
      for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 1) {
        *y = (float)(puVar3[lVar2] & 0xf) * local_74 + local_70 * local_48;
        y = y + 1;
      }
      for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 1) {
        *y = (float)(puVar3[lVar2] >> 4) * (float)local_79 * local_78 + (float)local_7a * local_48;
        y = y + 1;
      }
      puVar3 = puVar3 + 0x20;
      j = j + 2;
    }
  }
  return;
}

Assistant:

void dequantize_row_q4_K(const block_q4_K * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int nb = k / QK_K;

    for (int i = 0; i < nb; i++) {
        const uint8_t * q = x[i].qs;

        const float d   = GGML_FP16_TO_FP32(x[i].d);
        const float min = GGML_FP16_TO_FP32(x[i].dmin);

        int is = 0;
        uint8_t sc, m;
        for (int j = 0; j < QK_K; j += 64) {
            get_scale_min_k4(is + 0, x[i].scales, &sc, &m);
            const float d1 = d * sc; const float m1 = min * m;
            get_scale_min_k4(is + 1, x[i].scales, &sc, &m);
            const float d2 = d * sc; const float m2 = min * m;
            for (int l = 0; l < 32; ++l) *y++ = d1 * (q[l] & 0xF) - m1;
            for (int l = 0; l < 32; ++l) *y++ = d2 * (q[l]  >> 4) - m2;
            q += 32; is += 2;
        }
    }
}